

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase86::run(TestCase86 *this)

{
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  byte bytes [8];
  
  return;
}

Assistant:

TEST(Endian, EightBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};

  WireValue<uint64_t>* vals = reinterpret_cast<WireValue<uint64_t>*>(bytes);

  EXPECT_EQ(0xf0debc9a78563412, vals[0].get());

  vals[0].set(0x23456789abcdef01);

  EXPECT_EQ(0x01, bytes[0]);
  EXPECT_EQ(0xef, bytes[1]);
  EXPECT_EQ(0xcd, bytes[2]);
  EXPECT_EQ(0xab, bytes[3]);
  EXPECT_EQ(0x89, bytes[4]);
  EXPECT_EQ(0x67, bytes[5]);
  EXPECT_EQ(0x45, bytes[6]);
  EXPECT_EQ(0x23, bytes[7]);
}